

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::i2p_connection::
on_name_lookup<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,char_const*)>>
          (i2p_connection *this,error_code *ec,shared_ptr<libtorrent::i2p_stream> *param_2,
          _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_char_*)>
          *handler)

{
  bool bVar1;
  element_type *this_00;
  reference name_00;
  char *local_98;
  uint local_8c;
  void *local_88 [3];
  function<void_(const_boost::system::error_code_&,_const_char_*)> local_70;
  reference local_50;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>
  *nl;
  string name;
  _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_char_*)>
  *handler_local;
  shared_ptr<libtorrent::i2p_stream> *param_2_local;
  error_code *ec_local;
  i2p_connection *this_local;
  
  this->m_state = sam_idle;
  name.field_2._8_8_ = handler;
  this_00 = ::std::
            __shared_ptr_access<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  i2p_stream::name_lookup_abi_cxx11_((string *)&nl,this_00);
  bVar1 = ::std::__cxx11::
          list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
          ::empty(&this->m_name_lookup);
  if (!bVar1) {
    name_00 = ::std::__cxx11::
              list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
              ::front(&this->m_name_lookup);
    local_50 = name_00;
    ::std::function<void_(const_boost::system::error_code_&,_const_char_*)>::function
              (&local_70,&name_00->second);
    do_name_lookup<std::function<void(boost::system::error_code_const&,char_const*)>>
              (this,&name_00->first,&local_70);
    ::std::function<void_(const_boost::system::error_code_&,_const_char_*)>::~function(&local_70);
    ::std::__cxx11::
    list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
    ::pop_front(&this->m_name_lookup);
  }
  bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
  if (bVar1) {
    local_88[0] = (void *)0x0;
    ::std::
    _Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,char_const*)>
    ::operator()((_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,char_const*)>
                  *)handler,ec,local_88);
  }
  else {
    local_98 = (char *)::std::__cxx11::string::c_str();
    ::std::
    _Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,char_const*)>
    ::operator()((_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,char_const*)>
                  *)handler,ec,&local_98);
  }
  local_8c = (uint)bVar1;
  ::std::__cxx11::string::~string((string *)&nl);
  return;
}

Assistant:

void on_name_lookup(error_code const& ec, std::shared_ptr<i2p_stream>, Handler handler)
	{
		m_state = sam_idle;

		std::string name = m_sam_socket->name_lookup();
		if (!m_name_lookup.empty())
		{
			std::pair<std::string, name_lookup_handler>& nl = m_name_lookup.front();
			do_name_lookup(nl.first, std::move(nl.second));
			m_name_lookup.pop_front();
		}

		if (ec)
		{
			handler(ec, nullptr);
			return;
		}

		handler(ec, name.c_str());
	}